

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O3

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<1>::operator()
          (_defaultInitializer<1> *this,shared_ptr<Assimp::Blender::ElemBase> *out,char *reason)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Logger *this_01;
  
  this_01 = DefaultLogger::get();
  Logger::warn(this_01,reason);
  this_00 = (out->super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (out->super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (out->super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void operator ()(T& out, const char* reason = "<add reason>") {
        ASSIMP_LOG_WARN(reason);

        // ... and let the show go on
        _defaultInitializer<0 /*ErrorPolicy_Igno*/>()(out);
    }